

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O0

void Abc_NtkCheckAbsorb(Abc_Ntk_t *pNtk,int nLutSize)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  abctime aVar4;
  Vec_Int_t *p;
  Vec_Ptr_t *vFanins_00;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pObj_00;
  abctime aVar6;
  abctime clk;
  int Counter2;
  int Counter;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vFanins;
  Vec_Int_t *vCounts;
  int nLutSize_local;
  Abc_Ntk_t *pNtk_local;
  
  clk._4_4_ = 0;
  clk._0_4_ = 0;
  aVar4 = Abc_Clock();
  iVar1 = Abc_NtkObjNumMax(pNtk);
  p = Vec_IntStart(iVar1);
  vFanins_00 = Vec_PtrAlloc(100);
  for (Counter = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), Counter < iVar1; Counter = Counter + 1) {
    pAVar5 = Abc_NtkObj(pNtk,Counter);
    if ((pAVar5 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar5), iVar1 != 0)) {
      for (Counter2 = 0; iVar1 = Abc_ObjFaninNum(pAVar5), Counter2 < iVar1; Counter2 = Counter2 + 1)
      {
        pObj_00 = Abc_ObjFanin(pAVar5,Counter2);
        iVar1 = Abc_ObjIsNode(pObj_00);
        if ((iVar1 != 0) &&
           (iVar1 = Abc_ObjCheckAbsorb(pAVar5,pObj_00,nLutSize,vFanins_00), iVar1 != 0)) {
          uVar2 = Abc_ObjId(pObj_00);
          Vec_IntAddToEntry(p,uVar2,1);
          clk._4_4_ = clk._4_4_ + 1;
        }
      }
    }
  }
  Vec_PtrFree(vFanins_00);
  for (Counter = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), Counter < iVar1; Counter = Counter + 1) {
    pAVar5 = Abc_NtkObj(pNtk,Counter);
    if ((pAVar5 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar5), iVar1 != 0)) {
      uVar2 = Abc_ObjId(pAVar5);
      iVar1 = Vec_IntEntry(p,uVar2);
      iVar3 = Abc_ObjFanoutNum(pAVar5);
      if (iVar1 == iVar3) {
        clk._0_4_ = (uint)clk + 1;
      }
    }
  }
  iVar1 = Abc_NtkNodeNum(pNtk);
  iVar3 = Abc_NtkNodeNum(pNtk);
  printf("Absorted = %6d. (%6.2f %%)   Fully = %6d. (%6.2f %%)  ",
         ((double)(int)clk._4_4_ * 100.0) / (double)iVar1,
         ((double)(int)(uint)clk * 100.0) / (double)iVar3,(ulong)clk._4_4_,(ulong)(uint)clk);
  aVar6 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar6 - aVar4);
  return;
}

Assistant:

void Abc_NtkCheckAbsorb( Abc_Ntk_t * pNtk, int nLutSize )
{
    Vec_Int_t * vCounts;
    Vec_Ptr_t * vFanins;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Counter = 0, Counter2 = 0;
    abctime clk = Abc_Clock();
    vCounts = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    vFanins = Vec_PtrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    Abc_ObjForEachFanin( pObj, pFanin, k )
        if ( Abc_ObjIsNode(pFanin) && Abc_ObjCheckAbsorb( pObj, pFanin, nLutSize, vFanins ) )
        {
            Vec_IntAddToEntry( vCounts, Abc_ObjId(pFanin), 1 );
            Counter++;
        }
    Vec_PtrFree( vFanins );
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( Vec_IntEntry(vCounts, Abc_ObjId(pObj)) == Abc_ObjFanoutNum(pObj) )
        {
//            printf( "%d ", Abc_ObjId(pObj) );
            Counter2++;
        }
    printf( "Absorted = %6d. (%6.2f %%)   Fully = %6d. (%6.2f %%)  ", 
        Counter,  100.0 * Counter  / Abc_NtkNodeNum(pNtk), 
        Counter2, 100.0 * Counter2 / Abc_NtkNodeNum(pNtk) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}